

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

bool cmFileAPI::ReadQuery
               (string *query,vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_> *objects
               )

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  undefined1 local_c0 [8];
  Object o_3;
  Object o_2;
  Object o_1;
  undefined1 local_88 [8];
  Object o;
  undefined1 local_68 [8];
  string verStr;
  string kindName;
  size_type sep_pos;
  vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_> *objects_local;
  string *query_local;
  
  lVar2 = std::__cxx11::string::find((char)query,0x2d);
  if (lVar2 == -1) {
    return false;
  }
  std::__cxx11::string::substr((ulong)((long)&verStr.field_2 + 8),(ulong)query);
  std::__cxx11::string::substr((ulong)local_68,(ulong)query);
  pcVar3 = ObjectKindName(CodeModel);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&verStr.field_2 + 8),pcVar3);
  if (bVar1) {
    Object::Object((Object *)local_88);
    local_88._0_4_ = CodeModel;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,"v2");
    if (bVar1) {
      o.Kind = CMakeFiles;
      o._4_4_ = 0;
      std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::push_back
                (objects,(value_type *)local_88);
      query_local._7_1_ = true;
    }
    else {
      query_local._7_1_ = false;
    }
  }
  else {
    pcVar3 = ObjectKindName(Cache);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&verStr.field_2 + 8),pcVar3);
    if (bVar1) {
      Object::Object((Object *)&o_2.Version);
      o_2.Version._0_4_ = 1;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,"v2");
      if (bVar1) {
        std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::push_back
                  (objects,(value_type *)&o_2.Version);
        query_local._7_1_ = true;
      }
      else {
        query_local._7_1_ = false;
      }
    }
    else {
      pcVar3 = ObjectKindName(CMakeFiles);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&verStr.field_2 + 8),pcVar3);
      if (bVar1) {
        Object::Object((Object *)&o_3.Version);
        o_3.Version._0_4_ = 2;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68,"v1");
        if (bVar1) {
          o_2.Kind = Cache;
          o_2._4_4_ = 0;
          std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::push_back
                    (objects,(value_type *)&o_3.Version);
          query_local._7_1_ = true;
        }
        else {
          query_local._7_1_ = false;
        }
      }
      else {
        pcVar3 = ObjectKindName(InternalTest);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&verStr.field_2 + 8),pcVar3);
        if (bVar1) {
          Object::Object((Object *)local_c0);
          local_c0._0_4_ = InternalTest;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_68,"v1");
          if (bVar1) {
            o_3.Kind = Cache;
            o_3._4_4_ = 0;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_68,"v2");
            if (!bVar1) {
              query_local._7_1_ = false;
              goto LAB_0035a310;
            }
            o_3.Kind = CMakeFiles;
            o_3._4_4_ = 0;
          }
          std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::push_back
                    (objects,(value_type *)local_c0);
          query_local._7_1_ = true;
        }
        else {
          query_local._7_1_ = false;
        }
      }
    }
  }
LAB_0035a310:
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(verStr.field_2._M_local_buf + 8));
  return query_local._7_1_;
}

Assistant:

bool cmFileAPI::ReadQuery(std::string const& query,
                          std::vector<Object>& objects)
{
  // Parse the "<kind>-" syntax.
  std::string::size_type sep_pos = query.find('-');
  if (sep_pos == std::string::npos) {
    return false;
  }
  std::string kindName = query.substr(0, sep_pos);
  std::string verStr = query.substr(sep_pos + 1);
  if (kindName == ObjectKindName(ObjectKind::CodeModel)) {
    Object o;
    o.Kind = ObjectKind::CodeModel;
    if (verStr == "v2") {
      o.Version = 2;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::Cache)) {
    Object o;
    o.Kind = ObjectKind::Cache;
    if (verStr == "v2") {
      o.Version = 2;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::CMakeFiles)) {
    Object o;
    o.Kind = ObjectKind::CMakeFiles;
    if (verStr == "v1") {
      o.Version = 1;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::InternalTest)) {
    Object o;
    o.Kind = ObjectKind::InternalTest;
    if (verStr == "v1") {
      o.Version = 1;
    } else if (verStr == "v2") {
      o.Version = 2;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  return false;
}